

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeMemoryModelInstruction(UpgradeMemoryModel *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *this_00;
  Module *this_01;
  IRContext *pIVar1;
  Operand *local_1f0;
  Operand *local_1c8;
  uint local_1bc;
  iterator local_1b8;
  undefined8 local_1b0;
  SmallVector<unsigned_int,_2UL> local_1a8;
  SmallVector<unsigned_int,_2UL> local_180;
  Operand local_158;
  undefined1 local_128 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_100
  ;
  undefined1 local_f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  undefined1 local_d8 [8];
  string extension;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  undefined1 local_48 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  Instruction *local_18;
  Instruction *memory_model;
  UpgradeMemoryModel *this_local;
  
  memory_model = (Instruction *)this;
  this_01 = Pass::get_module(&this->super_Pass);
  local_18 = Module::GetMemoryModel(this_01);
  pIVar1 = Pass::context(&this->super_Pass);
  local_48._32_8_ = Pass::context(&this->super_Pass);
  local_48[0x1c] = '\x11';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48._20_4_ = 0;
  extension.field_2._12_4_ = 0x14e1;
  init_list_00._M_len = 1;
  init_list_00._M_array = (iterator)((long)&extension.field_2 + 0xc);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list_00);
  Operand::Operand(&local_78,SPV_OPERAND_TYPE_CAPABILITY,&local_a0);
  local_48._0_8_ = &local_78;
  local_48._8_8_ = (_func_int **)0x1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_20,(IRContext **)(local_48 + 0x20),(Op *)(local_48 + 0x1c),
             (int *)(local_48 + 0x18),(int *)(local_48 + 0x14),
             (initializer_list<spvtools::opt::Operand> *)local_48);
  IRContext::AddCapability(pIVar1,&local_20);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  local_1c8 = (Operand *)local_48;
  do {
    local_1c8 = local_1c8 + -1;
    Operand::~Operand(local_1c8);
  } while (local_1c8 != &local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"SPV_KHR_vulkan_memory_model",
             (allocator<char> *)
             ((long)&words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                    (string *)local_d8);
  pIVar1 = Pass::context(&this->super_Pass);
  local_128._32_8_ = Pass::context(&this->super_Pass);
  local_128[0x1c] = '\n';
  local_128[0x1d] = '\0';
  local_128[0x1e] = '\0';
  local_128[0x1f] = '\0';
  local_128[0x18] = '\0';
  local_128[0x19] = '\0';
  local_128[0x1a] = '\0';
  local_128[0x1b] = '\0';
  local_128._20_4_ = 0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            (&local_180,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  Operand::Operand(&local_158,SPV_OPERAND_TYPE_LITERAL_STRING,&local_180);
  local_128._0_8_ = &local_158;
  local_128._8_8_ = (_func_int **)0x1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_100,(IRContext **)(local_128 + 0x20),(Op *)(local_128 + 0x1c),
             (int *)(local_128 + 0x18),(int *)(local_128 + 0x14),
             (initializer_list<spvtools::opt::Operand> *)local_128);
  IRContext::AddExtension(pIVar1,&local_100);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_100);
  local_1f0 = (Operand *)local_128;
  do {
    local_1f0 = local_1f0 + -1;
    Operand::~Operand(local_1f0);
  } while (local_1f0 != &local_158);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
  this_00 = local_18;
  local_1bc = 3;
  local_1b8 = &local_1bc;
  local_1b0 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_1b8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a8,init_list);
  opt::Instruction::SetInOperand(this_00,1,&local_1a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  std::__cxx11::string::~string((string *)local_d8);
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeMemoryModelInstruction() {
  // Overall changes necessary:
  // 1. Add the OpExtension.
  // 2. Add the OpCapability.
  // 3. Modify the memory model.
  Instruction* memory_model = get_module()->GetMemoryModel();
  context()->AddCapability(MakeUnique<Instruction>(
      context(), spv::Op::OpCapability, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_CAPABILITY,
           {uint32_t(spv::Capability::VulkanMemoryModelKHR)}}}));
  const std::string extension = "SPV_KHR_vulkan_memory_model";
  std::vector<uint32_t> words = spvtools::utils::MakeVector(extension);
  context()->AddExtension(
      MakeUnique<Instruction>(context(), spv::Op::OpExtension, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_LITERAL_STRING, words}}));
  memory_model->SetInOperand(1u, {uint32_t(spv::MemoryModel::VulkanKHR)});
}